

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixBoundsPS::FixBoundsPS
          (FixBoundsPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,shared_ptr<soplex::Tolerances> *tols)

{
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pnVar5;
  undefined8 uVar6;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  undefined1 auVar8 [16];
  int iVar9;
  double *pdVar10;
  undefined8 *puVar11;
  VarStatus VVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_348;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_308;
  undefined8 uStack_300;
  cpp_dec_float<50U,_int,_void> local_2f8;
  fpclass_type local_2b8;
  int32_t iStack_2b4;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined **local_290;
  element_type *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  uint local_278 [2];
  uint auStack_270 [2];
  uint local_268 [2];
  uint auStack_260 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined1 local_158 [29];
  undefined3 uStack_13b;
  undefined1 auStack_138 [13];
  undefined8 local_128;
  undefined1 local_118 [40];
  int local_f0;
  bool local_ec;
  fpclass_type local_e8;
  int32_t iStack_e4;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  int local_b0;
  undefined1 local_ac;
  undefined8 local_a8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_288 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_280._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_280._M_pi)->_M_use_count = (local_280._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_280._M_pi)->_M_use_count = (local_280._M_pi)->_M_use_count + 1;
    }
  }
  iVar9 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar4 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_290 = &PTR__PostStep_003b3828;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b3828;
  (this->super_PostStep).m_name = "FixBounds";
  (this->super_PostStep).nCols = iVar4;
  (this->super_PostStep).nRows = iVar9;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_288;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_280);
  if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b3c60;
  this->m_j = j;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_168 = *(undefined8 *)(pnVar5[j].m_backend.data._M_elems + 8);
  local_188 = *(undefined8 *)&pnVar5[j].m_backend.data;
  uStack_180 = *(undefined8 *)(pnVar5[j].m_backend.data._M_elems + 2);
  puVar1 = pnVar5[j].m_backend.data._M_elems + 4;
  local_178 = *(undefined8 *)puVar1;
  uStack_170 = *(undefined8 *)(puVar1 + 2);
  iVar9 = pnVar5[j].m_backend.exp;
  bVar2 = pnVar5[j].m_backend.neg;
  local_2a8._0_4_ = pnVar5[j].m_backend.fpclass;
  local_2a8._4_4_ = pnVar5[j].m_backend.prec_elem;
  uStack_2a0 = 0;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar13 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              **)(pnVar5[j].m_backend.data._M_elems + 8);
  local_1b8 = pnVar5[j].m_backend.data._M_elems[0];
  auStack_1b0 = *(uint (*) [2])(pnVar5[j].m_backend.data._M_elems + 2);
  puVar1 = pnVar5[j].m_backend.data._M_elems + 4;
  local_1a8 = *(uint (*) [2])puVar1;
  auStack_1a0 = *(uint (*) [2])(puVar1 + 2);
  iVar4 = pnVar5[j].m_backend.exp;
  bVar3 = pnVar5[j].m_backend.neg;
  local_2b8 = pnVar5[j].m_backend.fpclass;
  iStack_2b4 = pnVar5[j].m_backend.prec_elem;
  uStack_2b0 = 0;
  local_308 = lp;
  local_198 = pnVar13;
  a = Tolerances::floatingPointFeastol
                ((this->super_PostStep)._tolerances.
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128._0_4_ = cpp_dec_float_finite;
  local_128._4_4_ = 10;
  local_158._0_16_ = (undefined1  [16])0x0;
  local_158._16_13_ = SUB1613((undefined1  [16])0x0,0);
  uStack_13b = 0;
  auStack_138 = SUB1613((undefined1  [16])0x0,3);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_158,a);
  local_d8 = local_188;
  uStack_d0 = uStack_180;
  local_c8 = local_178;
  uStack_c0 = uStack_170;
  local_b8 = local_168;
  local_a8 = local_2a8;
  local_118._0_4_ = local_1b8[0];
  local_118._4_4_ = local_1b8[1];
  local_118._8_4_ = auStack_1b0[0];
  local_118._12_4_ = auStack_1b0[1];
  local_118._16_4_ = local_1a8[0];
  local_118._20_4_ = local_1a8[1];
  local_118._24_4_ = auStack_1a0[0];
  local_118._28_4_ = auStack_1a0[1];
  local_118._32_8_ = local_198;
  local_e8 = local_2b8;
  iStack_e4 = iStack_2b4;
  local_f0 = iVar4;
  local_ec = bVar3;
  local_b0 = iVar9;
  local_ac = bVar2;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_2f8,(soplex *)&local_d8,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_118,pnVar13);
  auVar8 = (undefined1  [16])local_2f8.data._M_elems._0_16_;
  local_348.data._M_elems[8] = local_2f8.data._M_elems[8];
  local_348.data._M_elems[9] = local_2f8.data._M_elems[9];
  local_348.data._M_elems[4] = local_2f8.data._M_elems[4];
  local_348.data._M_elems[5] = local_2f8.data._M_elems[5];
  local_348.data._M_elems[0] = local_2f8.data._M_elems[0];
  local_348.data._M_elems[1] = local_2f8.data._M_elems[1];
  uVar6 = local_348.data._M_elems._0_8_;
  local_348.data._M_elems[2] = local_2f8.data._M_elems[2];
  local_348.data._M_elems[3] = local_2f8.data._M_elems[3];
  local_348.exp = local_2f8.exp;
  local_348.neg = local_2f8.neg;
  local_348.fpclass = local_2f8.fpclass;
  local_348.prec_elem = local_2f8.prec_elem;
  if ((local_2f8.neg == true) &&
     (local_348.data._M_elems[0] = auVar8._0_4_,
     local_348.data._M_elems[0] != 0 || local_2f8.fpclass != cpp_dec_float_finite)) {
    local_348.neg = false;
  }
  local_2f8.data._M_elems._0_16_ = auVar8;
  local_348.data._M_elems._0_8_ = uVar6;
  if (((local_2f8.fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_128 == cpp_dec_float_NaN))
     || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_348,(cpp_dec_float<50U,_int,_void> *)local_158), 0 < iVar9)) {
    local_1c8 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_1e8 = *(undefined8 *)(val->m_backend).data._M_elems;
    uStack_1e0 = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_1d8 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    uStack_1d0 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    iVar9 = (val->m_backend).exp;
    bVar2 = (val->m_backend).neg;
    local_2a8._0_4_ = (val->m_backend).fpclass;
    local_2a8._4_4_ = (val->m_backend).prec_elem;
    uStack_2a0 = 0;
    pnVar5 = (local_308->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar13 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)(pnVar5[j].m_backend.data._M_elems + 8);
    local_218 = pnVar5[j].m_backend.data._M_elems[0];
    auStack_210 = *(uint (*) [2])(pnVar5[j].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[j].m_backend.data._M_elems + 4;
    local_208 = *(uint (*) [2])puVar1;
    auStack_200 = *(uint (*) [2])(puVar1 + 2);
    iVar4 = pnVar5[j].m_backend.exp;
    bVar3 = pnVar5[j].m_backend.neg;
    local_2b8 = pnVar5[j].m_backend.fpclass;
    iStack_2b4 = pnVar5[j].m_backend.prec_elem;
    uStack_2b0 = 0;
    local_1f8 = pnVar13;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_68);
    local_d8 = local_1e8;
    uStack_d0 = uStack_1e0;
    local_c8 = local_1d8;
    uStack_c0 = uStack_1d0;
    local_b8 = local_1c8;
    local_a8 = local_2a8;
    local_118._0_4_ = local_218[0];
    local_118._4_4_ = local_218[1];
    local_118._8_4_ = auStack_210[0];
    local_118._12_4_ = auStack_210[1];
    local_118._16_4_ = local_208[0];
    local_118._20_4_ = local_208[1];
    local_118._24_4_ = auStack_200[0];
    local_118._28_4_ = auStack_200[1];
    local_118._32_8_ = local_1f8;
    local_e8 = local_2b8;
    iStack_e4 = iStack_2b4;
    local_f0 = iVar4;
    local_ec = bVar3;
    local_b0 = iVar9;
    local_ac = bVar2;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_2f8,(soplex *)&local_d8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_118,pnVar13);
    auVar8 = (undefined1  [16])local_2f8.data._M_elems._0_16_;
    local_348.data._M_elems[8] = local_2f8.data._M_elems[8];
    local_348.data._M_elems[9] = local_2f8.data._M_elems[9];
    local_348.data._M_elems[4] = local_2f8.data._M_elems[4];
    local_348.data._M_elems[5] = local_2f8.data._M_elems[5];
    local_348.data._M_elems[0] = local_2f8.data._M_elems[0];
    local_348.data._M_elems[1] = local_2f8.data._M_elems[1];
    uVar6 = local_348.data._M_elems._0_8_;
    local_348.data._M_elems[2] = local_2f8.data._M_elems[2];
    local_348.data._M_elems[3] = local_2f8.data._M_elems[3];
    local_348.exp = local_2f8.exp;
    local_348.neg = local_2f8.neg;
    local_348.fpclass = local_2f8.fpclass;
    local_348.prec_elem = local_2f8.prec_elem;
    if ((local_2f8.neg == true) &&
       (local_348.data._M_elems[0] = auVar8._0_4_,
       local_348.data._M_elems[0] != 0 || local_2f8.fpclass != cpp_dec_float_finite)) {
      local_348.neg = false;
    }
    local_2f8.data._M_elems._0_16_ = auVar8;
    local_348.data._M_elems._0_8_ = uVar6;
    if (((local_2f8.fpclass == cpp_dec_float_NaN) || (local_68.fpclass == cpp_dec_float_NaN)) ||
       (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_348,&local_68), 0 < iVar9)) {
      local_228 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_248 = *(undefined8 *)(val->m_backend).data._M_elems;
      uStack_240 = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_238 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
      uStack_230 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
      iVar9 = (val->m_backend).exp;
      bVar2 = (val->m_backend).neg;
      local_2a8._0_4_ = (val->m_backend).fpclass;
      local_2a8._4_4_ = (val->m_backend).prec_elem;
      uStack_2a0 = 0;
      pnVar5 = (local_308->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  **)(pnVar5[j].m_backend.data._M_elems + 8);
      local_278 = pnVar5[j].m_backend.data._M_elems[0];
      auStack_270 = *(uint (*) [2])(pnVar5[j].m_backend.data._M_elems + 2);
      puVar1 = pnVar5[j].m_backend.data._M_elems + 4;
      local_268 = *(uint (*) [2])puVar1;
      auStack_260 = *(uint (*) [2])(puVar1 + 2);
      iVar4 = pnVar5[j].m_backend.exp;
      bVar3 = pnVar5[j].m_backend.neg;
      local_2b8 = pnVar5[j].m_backend.fpclass;
      iStack_2b4 = pnVar5[j].m_backend.prec_elem;
      uStack_2b0 = 0;
      local_258 = pnVar13;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0);
      local_d8 = local_248;
      uStack_d0 = uStack_240;
      local_c8 = local_238;
      uStack_c0 = uStack_230;
      local_b8 = local_228;
      local_a8 = local_2a8;
      local_118._0_4_ = local_278[0];
      local_118._4_4_ = local_278[1];
      local_118._8_4_ = auStack_270[0];
      local_118._12_4_ = auStack_270[1];
      local_118._16_4_ = local_268[0];
      local_118._20_4_ = local_268[1];
      local_118._24_4_ = auStack_260[0];
      local_118._28_4_ = auStack_260[1];
      local_118._32_8_ = local_258;
      local_e8 = local_2b8;
      iStack_e4 = iStack_2b4;
      local_f0 = iVar4;
      local_ec = bVar3;
      local_b0 = iVar9;
      local_ac = bVar2;
      relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_2f8,(soplex *)&local_d8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_118,pnVar13);
      local_348.data._M_elems[8] = local_2f8.data._M_elems[8];
      local_348.data._M_elems[9] = local_2f8.data._M_elems[9];
      local_348.data._M_elems[4] = local_2f8.data._M_elems[4];
      local_348.data._M_elems[5] = local_2f8.data._M_elems[5];
      local_348.exp = local_2f8.exp;
      local_348.neg = local_2f8.neg;
      local_348.fpclass = local_2f8.fpclass;
      local_348.prec_elem = local_2f8.prec_elem;
      if ((local_2f8.neg == true) &&
         (local_348.data._M_elems[0] = local_2f8.data._M_elems[0],
         local_348.data._M_elems[0] != 0 || local_2f8.fpclass != cpp_dec_float_finite)) {
        local_348.neg = false;
      }
      if (((local_2f8.fpclass == cpp_dec_float_NaN) || (local_a0.fpclass == cpp_dec_float_NaN)) ||
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_348,&local_a0), 0 < iVar9)) {
        pSVar7 = local_308;
        pcVar14 = &(local_308->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[j].m_backend;
        ::soplex::infinity::__tls_init();
        pdVar10 = (double *)__tls_get_addr(&PTR_003b4b70);
        local_308 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)*pdVar10;
        uStack_300 = 0;
        local_348.fpclass = cpp_dec_float_finite;
        local_348.prec_elem = 10;
        local_348.data._M_elems[0] = 0;
        local_348.data._M_elems[1] = 0;
        local_348.data._M_elems[2] = 0;
        local_348.data._M_elems[3] = 0;
        local_348.data._M_elems[4] = 0;
        local_348.data._M_elems[5] = 0;
        local_348.data._M_elems._24_5_ = 0;
        local_348.data._M_elems[7]._1_3_ = 0;
        local_348.data._M_elems[8] = 0;
        local_348.data._M_elems[9] = 0;
        local_348.exp = 0;
        local_348.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_348,-(double)local_308);
        if (((pcVar14->fpclass != cpp_dec_float_NaN) && (local_348.fpclass != cpp_dec_float_NaN)) &&
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar14,&local_348), iVar9 < 1)) {
          pcVar14 = &(pSVar7->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[j].m_backend;
          ::soplex::infinity::__tls_init();
          local_2f8.fpclass = cpp_dec_float_finite;
          local_2f8.prec_elem = 10;
          local_2f8.data._M_elems[0] = 0;
          local_2f8.data._M_elems[1] = 0;
          local_2f8.data._M_elems[2] = 0;
          local_2f8.data._M_elems[3] = 0;
          local_2f8.data._M_elems[4] = 0;
          local_2f8.data._M_elems[5] = 0;
          local_2f8.data._M_elems._24_5_ = 0;
          local_2f8.data._M_elems[7]._1_3_ = 0;
          local_2f8.data._M_elems[8] = 0;
          local_2f8.data._M_elems[9] = 0;
          local_2f8.exp = 0;
          local_2f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_2f8,(double)local_308);
          if ((pcVar14->fpclass != cpp_dec_float_NaN) && (local_2f8.fpclass != cpp_dec_float_NaN)) {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar14,&local_2f8);
            VVar12 = ZERO;
            if (-1 < iVar9) goto LAB_0032477c;
          }
        }
        puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_348.data._M_elems._0_8_ = local_348.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_348,"XMAISM14 This should never happen.","");
        *puVar11 = &PTR__SPxException_003adbd8;
        puVar11[1] = puVar11 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar11 + 1),local_348.data._M_elems._0_8_,
                   local_348.data._M_elems._0_8_ + local_348.data._M_elems._8_8_);
        *puVar11 = &PTR__SPxException_003ae9a0;
        __cxa_throw(puVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      VVar12 = ON_UPPER;
    }
    else {
      VVar12 = ON_LOWER;
    }
  }
  else {
    VVar12 = FIXED;
  }
LAB_0032477c:
  this->m_status = VVar12;
  return;
}

Assistant:

FixBoundsPS(const SPxLPBase<R>& lp, int j, R val, std::shared_ptr<Tolerances> tols)
         : PostStep("FixBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
      {
         if(EQrel(lp.lower(j), lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::FIXED;
         else if(EQrel(val, lp.lower(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_LOWER;
         else if(EQrel(val, lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_UPPER;
         else if(lp.lower(j) <= R(-infinity) && lp.upper(j) >= R(infinity))
            m_status = SPxSolverBase<R>::ZERO;
         else
         {
            throw SPxInternalCodeException("XMAISM14 This should never happen.");
         }
      }